

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O3

void __thiscall NavierStokesBase::InitialRedistribution(NavierStokesBase *this)

{
  Box *pBVar1;
  IntVect *this_00;
  pointer pSVar2;
  EBCellFlagFab *this_01;
  BCRec *pBVar3;
  string redistribution_type;
  string redistribution_type_00;
  NavierStokesBase *pNVar4;
  int iVar5;
  TimeCenter TVar6;
  int iVar7;
  FabType FVar8;
  long lVar9;
  FabArray<amrex::EBCellFlagFab> *pFVar10;
  MultiCutFab *this_02;
  FabArray<amrex::FArrayBox> *this_03;
  int *piVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  Real time;
  undefined8 uVar15;
  undefined8 in_stack_fffffffffffff898;
  _Head_base<0UL,_amrex::MultiFab_*,_false> fabarray_;
  Array4<const_double> local_758;
  NavierStokesBase *local_718;
  Geometry *local_710;
  Box result;
  long *local_6c8 [2];
  long local_6b8 [2];
  long *local_6a8 [2];
  long local_698 [2];
  Box local_684;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> vfrac;
  Array4<const_double> ccc;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_amrex::EBCellFlag> local_4a0;
  MFIter mfi;
  Array4<double> local_400;
  FillPatchIterator S_fpi;
  MultiFab tmp;
  
  iVar5 = std::__cxx11::string::compare((char *)&redistribution_type_abi_cxx11_);
  if (iVar5 == 0) {
    if (verbose != 0) {
      S_fpi.super_MFIter.fabArray = (FabArrayBase *)amrex::OutStream();
      S_fpi.super_MFIter.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
           *(undefined4 *)(DAT_00816950 + -0x30);
      this_00 = &S_fpi.super_MFIter.tile_size;
      S_fpi.super_MFIter.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
           *(undefined4 *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      *(undefined8 *)
       ((long)S_fpi.super_MFIter.tile_size.vect +
       *(long *)(S_fpi.super_MFIter.tile_size.vect._0_8_ + -0x18) + 8) =
           *(undefined8 *)
            ((S_fpi.super_MFIter.fabArray)->_vptr_FabArrayBase[-3] +
            (long)&((S_fpi.super_MFIter.fabArray)->boxarray).m_bat);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Doing initial redistribution... ",0x20);
      std::ios::widen((char)*(undefined8 *)(S_fpi.super_MFIter.tile_size.vect._0_8_ + -0x18) +
                      (char)this_00);
      std::ostream::put((char)this_00);
      std::ostream::flush();
      amrex::Print::~Print((Print *)&S_fpi);
    }
    fabarray_._M_head_impl =
         *(MultiFab **)
          &(((this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start)->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    iVar5 = nghost_state(this);
    pSVar2 = (this->super_AmrLevel).state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_718 = this;
    TVar6 = amrex::StateDescriptor::timeType(pSVar2->desc);
    pNVar4 = local_718;
    if (TVar6 == Point) {
      time = (pSVar2->new_time).stop;
    }
    else {
      time = ((pSVar2->new_time).start + (pSVar2->new_time).stop) * 0.5;
    }
    amrex::FillPatchIterator::FillPatchIterator
              (&S_fpi,&local_718->super_AmrLevel,fabarray_._M_head_impl,iVar5,time,0,0,NUM_STATE);
    iVar5 = NUM_STATE;
    iVar7 = nghost_state(pNVar4);
    mfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
         )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
    mfi.fabArray = (FabArrayBase *)0x0;
    mfi.tile_size.vect[0] = 0;
    mfi.tile_size.vect[1] = 0;
    mfi.tile_size.vect[2] = 0;
    mfi.flags = '\0';
    mfi._29_3_ = 0;
    mfi.currentIndex = 0;
    mfi.beginIndex = 0;
    amrex::MultiFab::MultiFab
              (&tmp,&(pNVar4->super_AmrLevel).grids,&(pNVar4->super_AmrLevel).dmap,iVar5,iVar7,
               (MFInfo *)&mfi,
               (pNVar4->super_AmrLevel).m_factory._M_t.
               super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
               .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mfi.tile_size);
    iVar5 = NUM_STATE;
    iVar7 = nghost_state(pNVar4);
    amrex::MultiFab::Copy(&tmp,&S_fpi.m_fabs,0,0,iVar5,iVar7);
    amrex::MFIter::MFIter(&mfi,(FabArrayBase *)fabarray_._M_head_impl,true);
    if (mfi.currentIndex < mfi.endIndex) {
      local_710 = &(local_718->super_AmrLevel).geom;
      do {
        amrex::MFIter::tilebox(&local_684,&mfi);
        lVar9 = __dynamic_cast(((FabArrayBase *)((long)fabarray_._M_head_impl + 0xf0))->
                               _vptr_FabArrayBase,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                               &amrex::EBFArrayBoxFactory::typeinfo,0);
        if (lVar9 == 0) {
          __cxa_bad_cast();
        }
        pFVar10 = amrex::EBDataCollection::getMultiEBCellFlagFab
                            (*(EBDataCollection **)(lVar9 + 0xd8));
        piVar11 = &mfi.currentIndex;
        if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar11 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + mfi.currentIndex;
        }
        this_01 = (pFVar10->m_fabs_v).
                  super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar11];
        local_4a0.p = (this_01->super_BaseFab<amrex::EBCellFlag>).dptr;
        local_4a0.ncomp = (this_01->super_BaseFab<amrex::EBCellFlag>).nvar;
        pBVar1 = &(this_01->super_BaseFab<amrex::EBCellFlag>).domain;
        local_4a0.begin.z = (this_01->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        local_4a0.begin.x = (pBVar1->smallend).vect[0];
        local_4a0.begin.y = (pBVar1->smallend).vect[1];
        lVar12 = (long)(this_01->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
        lVar13 = (long)(this_01->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
        lVar14 = (long)(this_01->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
        local_4a0.jstride = (lVar13 - (pBVar1->smallend).vect[0]) + 1;
        local_4a0.kstride =
             (lVar12 - (this_01->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
             local_4a0.jstride;
        local_4a0.nstride = (lVar14 - local_4a0.begin.z) * local_4a0.kstride;
        local_4a0.end._0_8_ = lVar13 + 1U & 0xffffffff | lVar12 << 0x20;
        local_4a0.end.z = (int)lVar14;
        FVar8 = amrex::EBCellFlagFab::getType(this_01,&local_684);
        if (FVar8 != covered) {
          result.bigend.vect[2] = local_684.bigend.vect[2];
          result.btype.itype = local_684.btype.itype;
          result.smallend.vect[0] = local_684.smallend.vect[0];
          result.smallend.vect[1] = local_684.smallend.vect[1];
          result.smallend.vect[0] = result.smallend.vect[0] + -4;
          result.smallend.vect[1] = result.smallend.vect[1] + -4;
          result.smallend.vect[2] = local_684.smallend.vect[2] + -4;
          result.bigend.vect[0] = local_684.bigend.vect[0] + 4;
          result.bigend.vect[1] = local_684.bigend.vect[1] + 4;
          result.bigend.vect[2] = result.bigend.vect[2] + 4;
          FVar8 = amrex::EBCellFlagFab::getType(this_01,&result);
          if (FVar8 != regular) {
            result.bigend.vect[1] = 0;
            result.bigend.vect[2] = 0;
            result.btype.itype = 0;
            result.smallend.vect[0] = 0;
            result.smallend.vect[1] = 0;
            result.smallend.vect[2] = 0;
            result.bigend.vect[0] = 0;
            fcy.kstride = 0;
            fcy.nstride = 0;
            fcy.p = (double *)0x0;
            fcy.jstride = 0;
            fcy.begin.x = 1;
            fcy.begin.y = 1;
            fcy.begin.z = 1;
            fcy.end.x = 0;
            fcy.end.y = 0;
            fcy.end.z = 0;
            fcy.ncomp = 0;
            fcz.kstride = 0;
            fcz.nstride = 0;
            fcz.p = (double *)0x0;
            fcz.jstride = 0;
            fcz.begin.x = 1;
            fcz.begin.y = 1;
            fcz.begin.z = 1;
            fcz.end.x = 0;
            fcz.end.y = 0;
            fcz.end.z = 0;
            fcz.ncomp = 0;
            ccc.kstride = 0;
            ccc.nstride = 0;
            ccc.p = (double *)0x0;
            ccc.jstride = 0;
            ccc.begin.x = 1;
            ccc.begin.y = 1;
            ccc.begin.z = 1;
            ccc.end.x = 0;
            ccc.end.y = 0;
            ccc.end.z = 0;
            ccc.ncomp = 0;
            vfrac.kstride = 0;
            vfrac.nstride = 0;
            vfrac.p = (double *)0x0;
            vfrac.jstride = 0;
            vfrac.begin.x = 1;
            vfrac.begin.y = 1;
            vfrac.begin.z = 1;
            vfrac.end.x = 0;
            vfrac.end.y = 0;
            vfrac.end.z = 0;
            vfrac.ncomp = 0;
            apx.kstride = 0;
            apx.nstride = 0;
            apx.p = (double *)0x0;
            apx.jstride = 0;
            apx.begin.x = 1;
            apx.begin.y = 1;
            apx.begin.z = 1;
            apx.end.x = 0;
            apx.end.y = 0;
            apx.end.z = 0;
            apx.ncomp = 0;
            apy.kstride = 0;
            apy.nstride = 0;
            apy.p = (double *)0x0;
            apy.jstride = 0;
            apy.begin.x = 1;
            apy.begin.y = 1;
            apy.begin.z = 1;
            apy.end.x = 0;
            apy.end.y = 0;
            apy.end.z = 0;
            apy.ncomp = 0;
            apz.kstride = 0;
            apz.nstride = 0;
            apz.p = (double *)0x0;
            apz.jstride = 0;
            apz.begin.x = 1;
            apz.begin.y = 1;
            apz.begin.z = 1;
            apz.end.x = 0;
            apz.end.y = 0;
            apz.end.z = 0;
            apz.ncomp = 0;
            amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar9 + 0xd8));
            amrex::MultiCutFab::const_array(&local_758,(MultiCutFab *)local_400.p,&mfi);
            result.bigend.vect[1] = (int)local_758.kstride;
            result.bigend.vect[2] = (int)((ulong)local_758.kstride >> 0x20);
            result.btype.itype = (uint)local_758.nstride;
            result.smallend.vect[0] = (int)local_758.p;
            result.smallend.vect[1] = (int)((ulong)local_758.p >> 0x20);
            result.smallend.vect[2] = (int)local_758.jstride;
            result.bigend.vect[0] = (int)((ulong)local_758.jstride >> 0x20);
            amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar9 + 0xd8));
            amrex::MultiCutFab::const_array(&local_758,(MultiCutFab *)local_400.jstride,&mfi);
            fcy.end.z = local_758.end.z;
            fcy.ncomp = local_758.ncomp;
            fcy.begin.x = local_758.begin.x;
            fcy.begin.y = local_758.begin.y;
            amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar9 + 0xd8));
            amrex::MultiCutFab::const_array(&local_758,(MultiCutFab *)local_400.kstride,&mfi);
            fcz.end.z = local_758.end.z;
            fcz.ncomp = local_758.ncomp;
            fcz.begin.x = local_758.begin.x;
            fcz.begin.y = local_758.begin.y;
            this_02 = amrex::EBDataCollection::getCentroid(*(EBDataCollection **)(lVar9 + 0xd8));
            amrex::MultiCutFab::const_array(&local_758,this_02,&mfi);
            ccc.end.z = local_758.end.z;
            ccc.ncomp = local_758.ncomp;
            ccc.begin.x = local_758.begin.x;
            ccc.begin.y = local_758.begin.y;
            amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar9 + 0xd8));
            amrex::MultiCutFab::const_array(&local_758,(MultiCutFab *)local_400.p,&mfi);
            apx.end.z = local_758.end.z;
            apx.ncomp = local_758.ncomp;
            apx.begin.x = local_758.begin.x;
            apx.begin.y = local_758.begin.y;
            amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar9 + 0xd8));
            amrex::MultiCutFab::const_array(&local_758,(MultiCutFab *)local_400.jstride,&mfi);
            apy.end.z = local_758.end.z;
            apy.ncomp = local_758.ncomp;
            apy.begin.x = local_758.begin.x;
            apy.begin.y = local_758.begin.y;
            amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar9 + 0xd8));
            amrex::MultiCutFab::const_array(&local_758,(MultiCutFab *)local_400.kstride,&mfi);
            apz.end.z = local_758.end.z;
            apz.ncomp = local_758.ncomp;
            apz.begin.x = local_758.begin.x;
            apz.begin.y = local_758.begin.y;
            this_03 = &amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar9 + 0xd8))->
                       super_FabArray<amrex::FArrayBox>;
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_758,this_03,&mfi);
            vfrac.end.z = local_758.end.z;
            vfrac.ncomp = local_758.ncomp;
            vfrac.begin.x = local_758.begin.x;
            vfrac.begin.y = local_758.begin.y;
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&local_758,&S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,
                       &mfi);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_400,&tmp.super_FabArray<amrex::FArrayBox>,&mfi);
            pNVar4 = local_718;
            pBVar3 = (local_718->m_bcrec_velocity_d).m_data;
            local_6a8[0] = local_698;
            uVar15 = 0x3532b5;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_6a8,redistribution_type_abi_cxx11_._M_dataplus._M_p,
                       redistribution_type_abi_cxx11_._M_dataplus._M_p +
                       redistribution_type_abi_cxx11_._M_string_length);
            redistribution_type._M_string_length._0_4_ = 2;
            redistribution_type._M_dataplus._M_p = (pointer)local_6a8;
            redistribution_type._M_string_length._4_4_ = 0;
            redistribution_type.field_2._M_allocated_capacity = uVar15;
            redistribution_type.field_2._8_8_ = in_stack_fffffffffffff898;
            Redistribution::ApplyToInitialData
                      (&local_684,3,(Array4<double> *)&local_758,&local_400,&local_4a0,&apx,&apy,
                       &apz,&vfrac,(Array4<const_double> *)&result,&fcy,&fcz,&ccc,pBVar3,local_710,
                       redistribution_type,(int)fabarray_._M_head_impl,0.5);
            if (local_6a8[0] != local_698) {
              operator_delete(local_6a8[0],local_698[0] + 1);
            }
            iVar5 = NUM_SCALARS;
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)&local_758,&S_fpi.m_fabs.super_FabArray<amrex::FArrayBox>,
                       &mfi,3);
            amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      (&local_400,&tmp.super_FabArray<amrex::FArrayBox>,&mfi,3);
            pBVar3 = (pNVar4->m_bcrec_scalars_d).m_data;
            local_6c8[0] = local_6b8;
            uVar15 = 0x3533de;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_6c8,redistribution_type_abi_cxx11_._M_dataplus._M_p,
                       redistribution_type_abi_cxx11_._M_dataplus._M_p +
                       redistribution_type_abi_cxx11_._M_string_length);
            redistribution_type_00._M_string_length._0_4_ = 2;
            redistribution_type_00._M_dataplus._M_p = (pointer)local_6c8;
            redistribution_type_00._M_string_length._4_4_ = 0;
            redistribution_type_00.field_2._M_allocated_capacity = uVar15;
            redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff898;
            Redistribution::ApplyToInitialData
                      (&local_684,iVar5,(Array4<double> *)&local_758,&local_400,&local_4a0,&apx,&apy
                       ,&apz,&vfrac,(Array4<const_double> *)&result,&fcy,&fcz,&ccc,pBVar3,local_710,
                       redistribution_type_00,(int)fabarray_._M_head_impl,0.5);
            if (local_6c8[0] != local_6b8) {
              operator_delete(local_6c8[0],local_6b8[0] + 1);
            }
          }
        }
        amrex::MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    amrex::MFIter::~MFIter(&mfi);
    amrex::MultiFab::Copy(fabarray_._M_head_impl,&S_fpi.m_fabs,0,0,NUM_STATE,0);
    amrex::MultiFab::~MultiFab(&tmp);
    amrex::FillPatchIterator::~FillPatchIterator(&S_fpi);
  }
  return;
}

Assistant:

void
NavierStokesBase::InitialRedistribution ()
{
    // Next we must redistribute the initial solution if we are going to use
    // MergeRedist or StateRedist redistribution schemes
    if ( redistribution_type != "StateRedist" ) {
        return;
    }

    if (verbose) {
      amrex::Print() << "Doing initial redistribution... " << std::endl;
    }

    // Initial data are set at new time step
    MultiFab& S_new = get_new_data(State_Type);
    // We must fill internal ghost values before calling redistribution
    // We also need any physical boundary conditions imposed if we are
    //    calling state redistribution (because that calls the slope routine)
    FillPatchIterator S_fpi(*this, S_new, nghost_state(), state[State_Type].curTime(),
                            State_Type, 0, NUM_STATE);
    MultiFab& Smf=S_fpi.get_mf();

    MultiFab tmp( grids, dmap, NUM_STATE, nghost_state(), MFInfo(), Factory() );
    MultiFab::Copy(tmp, Smf, 0, 0, NUM_STATE, nghost_state());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(S_new,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();

        auto const& fact =  dynamic_cast<EBFArrayBoxFactory const&>(S_new.Factory());

        EBCellFlagFab const& flagfab = fact.getMultiEBCellFlagFab()[mfi];
        Array4<EBCellFlag const> const& flag = flagfab.const_array();

        // FIXME? not sure if 4 is really needed or if 3 could do
        // But this is a safe choice
        if ( (flagfab.getType(bx) != FabType::covered) &&
             (flagfab.getType(amrex::grow(bx,4)) != FabType::regular) )
        {
            Array4<Real const> AMREX_D_DECL(fcx, fcy, fcz), ccc, vfrac, AMREX_D_DECL(apx, apy, apz);

            AMREX_D_TERM(fcx = fact.getFaceCent()[0]->const_array(mfi);,
                         fcy = fact.getFaceCent()[1]->const_array(mfi);,
                         fcz = fact.getFaceCent()[2]->const_array(mfi););

            ccc   = fact.getCentroid().const_array(mfi);

            AMREX_D_TERM(apx = fact.getAreaFrac()[0]->const_array(mfi);,
                         apy = fact.getAreaFrac()[1]->const_array(mfi);,
                         apz = fact.getAreaFrac()[2]->const_array(mfi););

            vfrac = fact.getVolFrac().const_array(mfi);

            //FIXME: this is a hack due to separate bcrecs Maybe want to put in single array.
            Redistribution::ApplyToInitialData( bx, AMREX_SPACEDIM,
                                                Smf.array(mfi), tmp.array(mfi),
                                                flag, AMREX_D_DECL(apx, apy, apz), vfrac,
                                                AMREX_D_DECL(fcx, fcy, fcz),
                                                ccc, m_bcrec_velocity_d.dataPtr(),
                                                geom, redistribution_type);
            Redistribution::ApplyToInitialData( bx,NUM_SCALARS,
                                                Smf.array(mfi,Density), tmp.array(mfi,Density),
                                                flag, AMREX_D_DECL(apx, apy, apz), vfrac,
                                                AMREX_D_DECL(fcx, fcy, fcz),
                                                ccc,m_bcrec_scalars_d.dataPtr(),
                                                geom, redistribution_type);
        }
    }

    MultiFab::Copy(S_new, Smf, 0, 0, NUM_STATE, 0);
}